

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O0

void AppendToIntegers(DuckDB *db,atomic<bool> *success)

{
  DuckDB *in_RDI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  idx_t i;
  Connection con;
  undefined1 in_stack_ffffffffffffff6f;
  undefined7 in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  allocator local_61;
  string local_60 [32];
  string local_40 [8];
  ulong local_38;
  Connection local_30 [48];
  
  duckdb::Connection::Connection(local_30,in_RDI);
  for (local_38 = 0; local_38 < 2000; local_38 = local_38 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"INSERT INTO integers VALUES (1)",&local_61);
    duckdb::Connection::Query(local_40);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff77 = duckdb::BaseQueryResult::HasError();
    if ((in_stack_ffffffffffffff77 & 1) != 0) {
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 (bool)in_stack_ffffffffffffff6f);
    }
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x785866);
  }
  duckdb::Connection::~Connection(local_30);
  return;
}

Assistant:

static void AppendToIntegers(DuckDB *db, atomic<bool> *success) {
	Connection con(*db);
	for (idx_t i = 0; i < CONCURRENT_INDEX_INSERT_COUNT; i++) {
		auto result = con.Query("INSERT INTO integers VALUES (1)");
		if (result->HasError()) {
			*success = false;
		}
	}
}